

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O3

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  CTSize *pCVar1;
  ushort uVar2;
  uint uVar3;
  CTSize CVar4;
  CTState *cts;
  CType *pCVar5;
  uint64_t uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  TValue *pTVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  CType *pCVar17;
  byte bVar18;
  cTValue *pcVar19;
  cTValue *pcVar20;
  int iVar21;
  uint *puVar22;
  MSize nfpr;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int rcl [2];
  CCallState cc;
  CType *local_258;
  ulong local_248;
  uint local_230 [2];
  cTValue local_228;
  cTValue acStack_220 [2];
  cTValue *local_210;
  TValue *local_208;
  ulong local_200;
  ulong local_1f8;
  uint local_1f0;
  byte local_1ec;
  char local_1eb;
  byte local_1ea;
  byte local_1e9;
  cTValue local_1e8 [16];
  cTValue local_168 [6];
  cTValue local_138 [33];
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  pCVar17 = cts->tab;
  uVar13 = pCVar17[cd->ctypeid].info & 0xf0000000;
  local_258 = pCVar17 + cd->ctypeid;
  if (uVar13 == 0x20000000) {
    pCVar1 = &local_258->size;
    uVar13 = pCVar17[cd->ctypeid].info & 0xffff;
    if ((pCVar17[uVar13].info & 0xf0000000) != 0x60000000) {
      return -1;
    }
    local_258 = pCVar17 + uVar13;
    if (*pCVar1 != 4) goto LAB_0014ba56;
    local_1f8 = (ulong)(uint)cd[1].nextgc.gcptr64;
  }
  else {
    if (uVar13 != 0x60000000) {
      return -1;
    }
LAB_0014ba56:
    local_1f8 = cd[1].nextgc.gcptr64;
  }
  local_208 = L->top;
  memset(local_1e8,0,0xb0);
  uVar2 = (ushort)local_258->info;
  uVar13 = pCVar17[uVar2].info;
  pCVar17 = pCVar17 + uVar2;
  if ((uVar13 & 0xf8000000) == 0x38000000) {
    local_248 = 0;
    if ((pCVar17->size != 8) && (pCVar17->size != 0x10)) {
LAB_0014badd:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else {
    local_248 = 0;
    if ((uVar13 & 0xf4000000) == 0x34000000 || (uVar13 & 0xf0000000) == 0x10000000) {
      pvVar10 = lj_mem_newgco(L,(ulong)pCVar17->size + 0x10);
      *(undefined1 *)((long)pvVar10 + 9) = 10;
      *(ushort *)((long)pvVar10 + 10) = uVar2;
      pTVar11 = L->top;
      L->top = pTVar11 + 1;
      pTVar11->u64 = (ulong)pvVar10 | 0xfffa800000000000;
      if ((pCVar17->info & 0xf0000000) == 0x10000000) {
        local_228.u64 = 0;
        iVar21 = ccall_classify_struct(cts,pCVar17,(int *)&local_228.it64,0);
        local_1eb = iVar21 != 0;
        if ((bool)local_1eb) {
          local_168[0].u64 = (long)pvVar10 + 0x10;
        }
        local_248 = (ulong)(byte)local_1eb;
      }
      else {
        local_1eb = '\0';
      }
    }
  }
  local_210 = local_168;
  uVar12 = (ulong)local_258->sib;
  uVar9 = (uint)local_258->sib;
  pcVar20 = L->base + 1;
  uVar13 = 0;
  if (pcVar20 < local_208) {
    iVar21 = 1;
    uVar16 = 0;
    uVar13 = 0;
    do {
      if ((int)uVar12 == 0) {
        if ((local_258->info & 0x800000) == 0) goto LAB_0014c2fe;
        uVar9 = lj_ccall_ctid_vararg(cts,pcVar20);
        pCVar17 = cts->tab;
        uVar25 = 0;
      }
      else {
        pCVar17 = cts->tab;
        uVar25 = (ulong)pCVar17[uVar12 & 0xffffffff].sib;
        uVar9 = (uint)(ushort)pCVar17[uVar12 & 0xffffffff].info;
      }
      uVar3 = pCVar17[uVar9].info;
      pCVar17 = pCVar17 + uVar9;
      uVar9 = pCVar17->size;
      local_200 = uVar25;
      if (uVar3 < 0x10000000) {
        if (8 < uVar9) goto LAB_0014badd;
        uVar23 = uVar9 + 7 >> 3;
        uVar24 = uVar23;
        if ((uVar3 >> 0x1a & 1) == 0) goto LAB_0014bde7;
        bVar18 = 0;
LAB_0014bdc7:
        if (uVar23 + uVar13 < 9) {
          pcVar19 = local_1e8 + (ulong)uVar13 * 2;
          uVar13 = uVar23 + uVar13;
        }
        else {
LAB_0014be11:
          if (0x30000 < (pCVar17->info & 0xf0000)) {
            uVar9 = -1 << ((byte)(pCVar17->info + 0xd0000 >> 0x10) & 0xf);
            uVar16 = uVar16 + ~uVar9 & uVar9;
          }
          if (0x20 < uVar16 + uVar24) goto LAB_0014badd;
          pcVar19 = local_138 + uVar16;
          uVar16 = uVar16 + uVar24;
        }
LAB_0014be6e:
        lj_cconv_ct_tv(cts,pCVar17,(uint8_t *)&pcVar19->u64,pcVar20,iVar21 << 8);
        if (((pCVar17->info & 0xf4000000) == 0) && (uVar9 = pCVar17->size, uVar9 < 4)) {
          if ((pCVar17->info >> 0x17 & 1) == 0) {
            if (uVar9 == 1) {
              uVar9 = (uint)(char)*(byte *)pcVar19;
            }
            else {
              uVar9 = (uint)(short)*(ushort *)pcVar19;
            }
          }
          else if (uVar9 == 1) {
            uVar9 = (uint)*(byte *)pcVar19;
          }
          else {
            uVar9 = (uint)*(ushort *)pcVar19;
          }
          *(uint *)pcVar19 = uVar9;
        }
        uVar12 = local_200;
        if (((bool)(bVar18 & uVar24 == 2)) && (pcVar19 == local_1e8 + (ulong)(uVar13 - 2) * 2)) {
          local_1e8[(ulong)(uVar13 - 1) * 2] = pcVar19[1];
          pcVar19[1].u64 = 0;
        }
      }
      else {
        if ((uVar3 & 0xf8000000) == 0x38000000) {
          if ((uVar9 == 8) || (uVar9 == 0x10)) {
            uVar23 = 1;
            bVar18 = 0;
            uVar24 = uVar9 + 7 >> 3;
            goto LAB_0014bdc7;
          }
          goto LAB_0014badd;
        }
        if ((uVar3 & 0xf0000000) != 0x10000000) {
          uVar24 = 1;
          if ((uVar3 & 0xf4000000) == 0x34000000) {
            uVar23 = uVar9 + 7 >> 3;
            bVar18 = 1;
            uVar24 = uVar23;
            goto LAB_0014bdc7;
          }
LAB_0014bde7:
          uVar9 = uVar24 + (int)local_248;
          if (6 < uVar9) {
            bVar18 = 0;
            goto LAB_0014be11;
          }
          pcVar19 = local_168 + local_248;
          bVar18 = 0;
          local_248 = (ulong)uVar9;
          goto LAB_0014be6e;
        }
        local_230[0] = 0;
        local_230[1] = 0;
        iVar8 = ccall_classify_struct(cts,pCVar17,(int *)local_230,0);
        if (iVar8 != 0) {
          uVar24 = uVar9 + 7 >> 3;
          if (uVar9 + 7 < 0x18) goto LAB_0014bde7;
          bVar18 = 0;
          goto LAB_0014be11;
        }
        local_1ec = (byte)uVar16;
        local_1ea = (byte)local_248;
        local_1e9 = (byte)uVar13;
        local_228.u64 = 0;
        acStack_220[0].u64 = 0;
        pcVar19 = &local_228;
        lj_cconv_ct_tv(cts,pCVar17,(uint8_t *)&pcVar19->u64,pcVar20,iVar21 << 8);
        uVar14 = (ulong)local_1e9;
        uVar12 = (ulong)local_1ea;
        puVar22 = local_230;
        bVar7 = true;
        do {
          bVar15 = bVar7;
          if ((*puVar22 & 1) == 0) {
            local_248 = uVar12;
            if ((*puVar22 & 2) != 0) {
              if (7 < (uint)uVar14) goto LAB_0014c026;
              local_1e8[uVar14 * 2].u64 = *(uint64_t *)pcVar19;
              uVar14 = (ulong)((uint)uVar14 + 1);
            }
          }
          else {
            if (5 < (uint)uVar12) {
LAB_0014c026:
              uVar12 = (ulong)local_1ec;
              iVar8 = 2 - (uint)(local_230[1] == 0);
              uVar13 = iVar8 + (uint)local_1ec;
              if (0x20 < uVar13) goto LAB_0014badd;
              local_1ec = (byte)uVar13;
              memcpy(local_138 + uVar12,&local_228,(ulong)(uint)(iVar8 * 8));
              local_248 = (ulong)local_1ea;
              uVar14 = (ulong)local_1e9;
              goto LAB_0014c069;
            }
            local_248 = (ulong)((uint)uVar12 + 1);
            local_168[uVar12].u64 = *(uint64_t *)pcVar19;
          }
          pcVar19 = acStack_220;
          uVar12 = local_248;
          puVar22 = local_230 + 1;
          bVar7 = false;
        } while (bVar15);
        local_1ea = (byte)local_248;
        local_1e9 = (byte)uVar14;
LAB_0014c069:
        uVar16 = (uint)local_1ec;
        local_248 = local_248 & 0xff;
        uVar13 = (uint)(byte)uVar14;
        uVar12 = uVar25;
      }
      uVar9 = (uint)uVar12;
      iVar21 = iVar21 + 1;
      pcVar20 = pcVar20 + 1;
    } while (pcVar20 < local_208);
  }
  else {
    uVar16 = 0;
  }
  if (uVar9 != 0) {
LAB_0014c2fe:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  local_1e9 = (byte)uVar13;
  local_1ec = (byte)uVar16;
  local_1f0 = 8;
  if (1 < uVar16) {
    local_1f0 = uVar16 * 8 | 8;
  }
  pCVar17 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  lj_vm_ffi_call();
  if ((cts->cb).slot != 0xffffffff) {
    local_228.u64 = local_1f8 >> 2;
    pTVar11 = lj_tab_set(L,cts->miscmap,&local_228);
    pTVar11->u64 = 0xfffeffffffffffff;
  }
  pCVar5 = cts->tab;
  uVar2 = *(ushort *)((long)local_258 + ((long)pCVar5 - (long)pCVar17));
  uVar13 = pCVar5[uVar2].info;
  if ((uVar13 & 0xf0000000) == 0x40000000) {
    return 0;
  }
  pCVar5 = pCVar5 + uVar2;
  if ((uVar13 & 0xf0000000) == 0x10000000) {
    if (local_1eb == '\0') {
      uVar12 = L->top[-1].u64;
      local_230[0] = 0;
      local_230[1] = 0;
      uVar25 = 0;
      ccall_classify_struct(cts,pCVar5,(int *)local_230,0);
      uVar13 = pCVar5->size;
      uVar9 = 0;
      pcVar20 = &local_228;
      puVar22 = local_230;
      bVar7 = true;
      do {
        bVar15 = bVar7;
        if ((*puVar22 & 1) == 0) {
          if ((*puVar22 & 2) != 0) {
            pcVar19 = local_1e8 + uVar25 * 2;
            uVar25 = (ulong)((int)uVar25 + 1);
            goto LAB_0014c1f9;
          }
        }
        else {
          uVar14 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          pcVar19 = local_168 + uVar14;
LAB_0014c1f9:
          *pcVar20 = *pcVar19;
        }
        pcVar20 = acStack_220;
        puVar22 = local_230 + 1;
        bVar7 = false;
      } while (bVar15);
      memcpy((void *)((uVar12 & 0x7fffffffffff) + 0x10),&local_228,(ulong)uVar13);
    }
LAB_0014c27d:
    iVar21 = 1;
  }
  else {
    if ((uVar13 & 0xf4000000) == 0x4000000) {
LAB_0014c290:
      local_210 = local_1e8;
    }
    else {
      if ((uVar13 & 0xf4000000) == 0x34000000) {
        uVar12 = L->top[-1].u64 & 0x7fffffffffff;
        CVar4 = pCVar5->size;
        *(cTValue *)(uVar12 + 0x10) = local_1e8[0];
        if (CVar4 != 8) {
          *(cTValue *)(uVar12 + 0x18) = local_1e8[2];
        }
        goto LAB_0014c27d;
      }
      if ((uVar13 & 0xf8000000) == 0x38000000) goto LAB_0014c290;
    }
    iVar21 = lj_cconv_tv_ct(cts,pCVar5,0,L->top + -1,(uint8_t *)&local_210->u64);
    if (iVar21 < 1) {
      return 1;
    }
  }
  uVar13 = iVar21 + 1;
  do {
    uVar6 = (L->glref).ptr64;
    if (*(ulong *)(uVar6 + 0x18) <= *(ulong *)(uVar6 + 0x10)) {
      lj_gc_step(L);
    }
    uVar13 = uVar13 - 1;
  } while (1 < uVar13);
  return 1;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}